

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

string * __thiscall Tools::CheckLine(string *__return_storage_ptr__,Tools *this,string *arg)

{
  bool bVar1;
  allocator<char> local_21;
  string *local_20;
  string *arg_local;
  Tools *this_local;
  
  local_20 = arg;
  arg_local = (string *)this;
  this_local = (Tools *)__return_storage_ptr__;
  bVar1 = std::operator!=(arg,".");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)arg);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"dot",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string CheckLine(string arg) {
        if (arg != ".") {
            return arg;
        }

        return "dot";
    }